

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall
pbrt::RealisticCamera::DrawRayPathFromFilm
          (RealisticCamera *this,Ray *r,bool arrow,bool toOpticalIntercept)

{
  undefined8 uVar1;
  LensElementInterface *pLVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  uint uVar10;
  char *pcVar11;
  uint uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  float fVar15;
  Float FVar16;
  Interval<float> i;
  Interval<float> i_00;
  Interval<float> i_01;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar39;
  undefined1 auVar40 [16];
  Float t;
  Ray local_d0;
  undefined1 local_a8 [16];
  Point3fi local_98;
  int vb;
  Float va;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  if ((DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera == '\0') &&
     (iVar9 = __cxa_guard_acquire(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera),
     iVar9 != 0)) {
    Scale(&DrawRayPathFromFilm::LensFromCamera,1.0,1.0,-1.0);
    __cxa_guard_release(&DrawRayPathFromFilm(pbrt::Ray_const&,bool,bool)::LensFromCamera);
  }
  fVar23 = (r->o).super_Tuple3<pbrt::Point3,_float>.x;
  auVar14._4_4_ = fVar23;
  auVar14._0_4_ = fVar23;
  auVar14._8_4_ = fVar23;
  auVar14._12_4_ = fVar23;
  fVar23 = (r->o).super_Tuple3<pbrt::Point3,_float>.y;
  auVar13._4_4_ = fVar23;
  auVar13._0_4_ = fVar23;
  auVar13._8_4_ = fVar23;
  auVar13._12_4_ = fVar23;
  fVar23 = (r->o).super_Tuple3<pbrt::Point3,_float>.z;
  auVar27._4_4_ = fVar23;
  auVar27._0_4_ = fVar23;
  auVar27._8_4_ = fVar23;
  auVar27._12_4_ = fVar23;
  auVar14 = vmovlhps_avx(auVar14,auVar13);
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.x = auVar14._0_4_;
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.y = auVar14._4_4_;
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.z = auVar14._8_4_;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x = auVar14._12_4_;
  uVar1 = vmovlps_avx(auVar27);
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar1;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)((ulong)uVar1 >> 0x20);
  Transform::operator()(&local_98,&DrawRayPathFromFilm::LensFromCamera,(Point3fi *)&local_d0);
  fVar23 = (r->d).super_Tuple3<pbrt::Vector3,_float>.y;
  fVar39 = (r->d).super_Tuple3<pbrt::Vector3,_float>.x;
  fVar15 = (r->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar14 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * DrawRayPathFromFilm::LensFromCamera.m.m[1][1])),
                            ZEXT416((uint)fVar39),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[1][0]));
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * DrawRayPathFromFilm::LensFromCamera.m.m[0][1])),
                            ZEXT416((uint)fVar39),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[0][0]));
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * DrawRayPathFromFilm::LensFromCamera.m.m[2][1])),
                            ZEXT416((uint)fVar39),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[2][0]));
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)fVar15),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[1][2]));
  auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar15),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[0][2]));
  auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar15),
                            ZEXT416((uint)DrawRayPathFromFilm::LensFromCamera.m.m[2][2]));
  auVar24._0_12_ = ZEXT812(0);
  auVar24._12_4_ = 0;
  fVar23 = auVar14._0_4_;
  auVar17 = vfmadd231ss_fma(ZEXT416((uint)(fVar23 * fVar23)),auVar13,auVar13);
  auVar17 = vfmadd231ss_fma(auVar17,auVar27,auVar27);
  if (auVar17._0_4_ <= 0.0) {
    auVar17._8_8_ = 0;
    auVar17._0_4_ =
         local_98.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.low;
    auVar17._4_4_ =
         local_98.super_Point3<pbrt::Interval<float>_>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z.high;
    local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar27._0_4_;
  }
  else {
    auVar28._8_4_ = 0x7fffffff;
    auVar28._0_8_ = 0x7fffffff7fffffff;
    auVar28._12_4_ = 0x7fffffff;
    auVar3 = vandps_avx(auVar14,auVar28);
    auVar4 = vandps_avx(auVar13,auVar28);
    auVar28 = vandps_avx(auVar27,auVar28);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(auVar3._0_4_ * 0.0)),auVar24,auVar4);
    auVar24 = vfmadd231ss_fma(auVar3,auVar24,auVar28);
    fVar15 = auVar24._0_4_ / auVar17._0_4_;
    fVar39 = auVar13._0_4_ * fVar15;
    local_78 = ZEXT416((uint)(auVar27._0_4_ * fVar15));
    i.high = fVar39;
    i.low = fVar39;
    local_48 = ZEXT416((uint)(fVar23 * fVar15));
    local_a8 = auVar27;
    local_68 = auVar14;
    local_58 = auVar13;
    auVar20._0_8_ = Interval<float>::operator+<float>((Interval<float> *)&local_98,i);
    auVar20._8_56_ = extraout_var;
    uVar1 = vmovlps_avx(auVar20._0_16_);
    local_98.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.low = (float)uVar1;
    local_98.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .x.high = (float)((ulong)uVar1 >> 0x20);
    i_00.high = (float)local_48._0_4_;
    i_00.low = (float)local_48._0_4_;
    auVar21._0_8_ =
         Interval<float>::operator+<float>
                   (&local_98.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y,i_00);
    auVar21._8_56_ = extraout_var_00;
    uVar1 = vmovlps_avx(auVar21._0_16_);
    local_98.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.low = (float)uVar1;
    local_98.super_Point3<pbrt::Interval<float>_>.super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>
    .y.high = (float)((ulong)uVar1 >> 0x20);
    i_01.high = (float)local_78._0_4_;
    i_01.low = (float)local_78._0_4_;
    auVar22._0_8_ =
         Interval<float>::operator+<float>
                   (&local_98.super_Point3<pbrt::Interval<float>_>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z,i_01);
    auVar22._8_56_ = extraout_var_01;
    auVar17 = auVar22._0_16_;
    auVar14 = local_68;
    auVar13 = local_58;
    local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z = (float)local_a8._0_4_;
  }
  auVar4._4_4_ = local_98.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
  auVar4._0_4_ = local_98.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
  auVar4._8_4_ = local_98.super_Point3<pbrt::Interval<float>_>.
                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low;
  auVar4._12_4_ =
       local_98.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.high;
  auVar27 = vhaddps_avx(auVar17,auVar17);
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.z = auVar27._0_4_ * 0.5;
  local_d0.time = r->time;
  local_d0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(r->medium).
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  auVar14 = vinsertps_avx(auVar13,auVar14,0x10);
  auVar13 = vinsertps_avx(auVar4,ZEXT416((uint)local_98.super_Point3<pbrt::Interval<float>_>.
                                               super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.
                                               high),0x10);
  auVar29._0_4_ =
       local_98.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high + auVar13._0_4_;
  auVar29._4_4_ =
       local_98.super_Point3<pbrt::Interval<float>_>.
       super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low + auVar13._4_4_;
  auVar29._8_4_ = auVar13._8_4_ + 0.0;
  auVar29._12_4_ = auVar13._12_4_ + 0.0;
  auVar3._8_4_ = 0x3f000000;
  auVar3._0_8_ = 0x3f0000003f000000;
  auVar3._12_4_ = 0x3f000000;
  auVar13 = vmulps_avx512vl(auVar29,auVar3);
  uVar1 = vmovlps_avx(auVar13);
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar1;
  local_d0.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar1 >> 0x20);
  uVar1 = vmovlps_avx(auVar14);
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
  printf("{ ");
  FVar16 = TraceLensesFromFilm(this,r,(Ray *)0x0);
  pcVar11 = "Dashed, RGBColor[.8, .5, .5]";
  local_a8 = ZEXT816(0);
  if (FVar16 != 0.0) {
    pcVar11 = "RGBColor[.5, .5, .8]";
  }
  if (NAN(FVar16)) {
    pcVar11 = "RGBColor[.5, .5, .8]";
  }
  printf(pcVar11);
  uVar12 = (int)(this->elementInterfaces).nStored - 1;
  if (-1 < (int)uVar12) {
    local_78._0_4_ = (int)CONCAT71(in_register_00000011,arrow);
    local_68._0_4_ = (int)CONCAT71(in_register_00000009,toOpticalIntercept);
    fVar23 = 0.0;
    do {
      pLVar2 = (this->elementInterfaces).ptr;
      uVar10 = uVar12 & 0x7fffffff;
      FVar16 = pLVar2[uVar10].curvatureRadius;
      fVar23 = fVar23 - pLVar2[uVar10].thickness;
      local_98.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low = 0.0;
      local_98.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high = 0.0;
      local_98.super_Point3<pbrt::Interval<float>_>.
      super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low = 0.0;
      local_a8._0_4_ = FVar16;
      local_58._0_4_ = fVar23;
      if ((FVar16 != 0.0) || (NAN(FVar16))) {
        bVar8 = IntersectSphericalElement(FVar16,fVar23 + FVar16,&local_d0,&t,(Normal3f *)&local_98)
        ;
        if (!bVar8) goto LAB_00393196;
      }
      else {
        auVar5._8_4_ = 0x80000000;
        auVar5._0_8_ = 0x8000000080000000;
        auVar5._12_4_ = 0x80000000;
        auVar14 = vxorps_avx512vl(ZEXT416((uint)(local_d0.o.super_Tuple3<pbrt::Point3,_float>.z -
                                                fVar23)),auVar5);
        t = auVar14._0_4_ / local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
      }
      vb = 0;
      va = t;
      if (t < 0.0) {
        LogFatal<char_const(&)[2],char_const(&)[2],char_const(&)[2],float&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cameras.cpp"
                   ,0x463,"Check failed: %s >= %s with %s = %s, %s = %s",(char (*) [2])0x61d07f,
                   (char (*) [2])0x621a47,(char (*) [2])0x61d07f,&va,(char (*) [2])0x621a47,&vb);
      }
      printf(", Line[{{%f, %f}, {%f, %f}}]",(double)local_d0.o.super_Tuple3<pbrt::Point3,_float>.z,
             (double)local_d0.o.super_Tuple3<pbrt::Point3,_float>.x,
             (double)(local_d0.o.super_Tuple3<pbrt::Point3,_float>.z +
                     t * local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z),
             (double)(local_d0.o.super_Tuple3<pbrt::Point3,_float>.x +
                     t * local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x));
      auVar18._8_8_ = 0;
      auVar18._0_8_ =
           CONCAT44(local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y,
                    local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x);
      auVar32._0_4_ =
           t * local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x +
           local_d0.o.super_Tuple3<pbrt::Point3,_float>.x;
      auVar32._4_4_ =
           t * local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y +
           local_d0.o.super_Tuple3<pbrt::Point3,_float>.y;
      auVar32._8_4_ = t * 0.0 + 0.0;
      auVar32._12_4_ = t * 0.0 + 0.0;
      auVar25._0_4_ = auVar32._0_4_ * auVar32._0_4_;
      auVar25._4_4_ = auVar32._4_4_ * auVar32._4_4_;
      auVar25._8_4_ = auVar32._8_4_ * auVar32._8_4_;
      auVar25._12_4_ = auVar32._12_4_ * auVar32._12_4_;
      auVar14 = vmovshdup_avx(auVar25);
      auVar14 = vfmadd231ss_fma(auVar14,auVar32,auVar32);
      if (pLVar2[uVar10].apertureRadius * pLVar2[uVar10].apertureRadius < auVar14._0_4_)
      goto LAB_00393196;
      local_d0.o.super_Tuple3<pbrt::Point3,_float>.z =
           t * local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z +
           local_d0.o.super_Tuple3<pbrt::Point3,_float>.z;
      uVar1 = vmovlps_avx(auVar32);
      local_d0.o.super_Tuple3<pbrt::Point3,_float>.x = (float)uVar1;
      local_d0.o.super_Tuple3<pbrt::Point3,_float>.y = (float)((ulong)uVar1 >> 0x20);
      if (((float)local_a8._0_4_ != 0.0) || (NAN((float)local_a8._0_4_))) {
        fVar23 = 1.0;
        if (uVar12 != 0) {
          fVar39 = (this->elementInterfaces).ptr[uVar12 - 1].eta;
          if ((fVar39 != 0.0) || (NAN(fVar39))) {
            fVar23 = fVar39;
          }
        }
        auVar38._0_4_ =
             local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x *
             local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x;
        auVar38._4_4_ =
             local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y *
             local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y;
        auVar38._8_8_ = 0;
        auVar14 = vmovshdup_avx(auVar38);
        auVar14 = vfmadd231ss_fma(auVar14,auVar18,auVar18);
        auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_d0.d.
                                                        super_Tuple3<pbrt::Vector3,_float>.z),
                                  ZEXT416((uint)local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z));
        auVar33._0_8_ =
             CONCAT44(local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y,
                      local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x) ^ 0x8000000080000000;
        auVar33._8_4_ = 0x80000000;
        auVar33._12_4_ = 0x80000000;
        auVar37._0_4_ = -local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar37._4_4_ = 0x80000000;
        auVar37._8_4_ = 0x80000000;
        auVar37._12_4_ = 0x80000000;
        fVar23 = fVar23 / pLVar2[uVar10].eta;
        auVar14 = vsqrtss_avx(auVar14,auVar14);
        fVar39 = auVar14._0_4_;
        auVar30._4_4_ = fVar39;
        auVar30._0_4_ = fVar39;
        auVar30._8_4_ = fVar39;
        auVar30._12_4_ = fVar39;
        auVar19._0_4_ = auVar37._0_4_ / fVar39;
        auVar19._4_12_ = auVar37._4_12_;
        auVar14 = vdivps_avx(auVar33,auVar30);
        auVar34._4_4_ =
             local_98.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high;
        auVar34._0_4_ =
             local_98.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low;
        auVar34._8_8_ = 0;
        auVar13 = vmovshdup_avx(auVar34);
        auVar27 = vmovshdup_avx(auVar14);
        auVar13 = vfmadd213ss_fma(auVar13,auVar27,
                                  ZEXT416((uint)(local_98.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low * auVar19._0_4_)));
        auVar27 = vfmsub231ss_fma(ZEXT416((uint)(local_98.super_Point3<pbrt::Interval<float>_>.
                                                 super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.
                                                 y.low * auVar19._0_4_)),
                                  ZEXT416((uint)local_98.super_Point3<pbrt::Interval<float>_>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y
                                                .low),auVar19);
        auVar27 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ + auVar27._0_4_)),auVar34,auVar14);
        auVar13 = vfnmadd213ss_fma(auVar27,auVar27,SUB6416(ZEXT464(0x3f800000),0));
        auVar13 = vmaxss_avx(auVar13,ZEXT816(0) << 0x40);
        fVar39 = auVar13._0_4_ / (fVar23 * fVar23);
        if (1.0 <= fVar39) goto LAB_00393196;
        auVar40._4_4_ = fVar23;
        auVar40._0_4_ = fVar23;
        auVar40._8_4_ = fVar23;
        auVar40._12_4_ = fVar23;
        auVar14 = vdivps_avx(auVar14,auVar40);
        auVar13 = vmaxss_avx(ZEXT416((uint)(1.0 - fVar39)),ZEXT816(0) << 0x40);
        auVar13 = vsqrtss_avx(auVar13,auVar13);
        fVar39 = auVar27._0_4_ / fVar23 - auVar13._0_4_;
        auVar35._0_4_ =
             local_98.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low * fVar39;
        auVar35._4_4_ =
             local_98.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.high * fVar39;
        auVar35._8_4_ = fVar39 * 0.0;
        auVar35._12_4_ = fVar39 * 0.0;
        local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z =
             local_98.super_Point3<pbrt::Interval<float>_>.
             super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.y.low * fVar39 -
             auVar19._0_4_ / fVar23;
        auVar14 = vsubps_avx(auVar35,auVar14);
        uVar1 = vmovlps_avx(auVar14);
        local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
        local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
      }
      uVar12 = uVar12 - 1;
      fVar23 = (float)local_58._0_4_;
    } while (-1 < (int)uVar12);
    toOpticalIntercept = local_68[0];
    arrow = local_78[0];
    local_a8 = ZEXT416((uint)((float)local_58._0_4_ * 0.25));
  }
  auVar26._4_4_ = local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar26._0_4_ = local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar26._8_8_ = 0;
  auVar31._0_4_ =
       local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x *
       local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar31._4_4_ =
       local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y *
       local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar31._8_8_ = 0;
  auVar14 = vmovshdup_avx(auVar31);
  auVar14 = vfmadd231ss_fma(auVar14,auVar26,auVar26);
  auVar14 = vfmadd231ss_fma(auVar14,ZEXT416((uint)local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z),
                            ZEXT416((uint)local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z));
  auVar14 = vsqrtss_avx(auVar14,auVar14);
  fVar39 = auVar14._0_4_;
  auVar36._4_4_ = fVar39;
  auVar36._0_4_ = fVar39;
  auVar36._8_4_ = fVar39;
  auVar36._12_4_ = fVar39;
  auVar14 = vdivps_avx(auVar26,auVar36);
  fVar23 = auVar14._0_4_;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z =
       local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z / fVar39;
  uVar1 = vmovlps_avx(auVar14);
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)uVar1;
  local_d0.d.super_Tuple3<pbrt::Vector3,_float>.y = (float)((ulong)uVar1 >> 0x20);
  if (toOpticalIntercept == false) {
    auVar7._8_4_ = 0x7fffffff;
    auVar7._0_8_ = 0x7fffffff7fffffff;
    auVar7._12_4_ = 0x7fffffff;
    local_a8 = vandps_avx512vl(local_a8,auVar7);
  }
  else {
    auVar6._8_4_ = 0x80000000;
    auVar6._0_8_ = 0x8000000080000000;
    auVar6._12_4_ = 0x80000000;
    auVar14 = vxorps_avx512vl(ZEXT416((uint)local_d0.o.super_Tuple3<pbrt::Point3,_float>.x),auVar6);
    local_a8._0_4_ = auVar14._0_4_ / fVar23;
    local_a8._4_12_ = auVar14._4_12_;
    printf(", Point[{%f, %f}]",
           (double)(local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z * (float)local_a8._0_4_ +
                   local_d0.o.super_Tuple3<pbrt::Point3,_float>.z),
           (double)(local_d0.o.super_Tuple3<pbrt::Point3,_float>.x + fVar23 * (float)local_a8._0_4_)
          );
    fVar23 = local_d0.d.super_Tuple3<pbrt::Vector3,_float>.x;
  }
  pcVar11 = "Line";
  if (arrow != false) {
    pcVar11 = "Arrow";
  }
  printf(", %s[{{%f, %f}, {%f, %f}}]",(double)local_d0.o.super_Tuple3<pbrt::Point3,_float>.z,
         (double)local_d0.o.super_Tuple3<pbrt::Point3,_float>.x,
         (double)(local_d0.o.super_Tuple3<pbrt::Point3,_float>.z +
                 local_a8._0_4_ * local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z),
         (double)(local_d0.o.super_Tuple3<pbrt::Point3,_float>.x + local_a8._0_4_ * fVar23),pcVar11)
  ;
  if (toOpticalIntercept != false) {
    printf(", Line[{{%f, 0}, {%f, 0}}]",(double)local_d0.o.super_Tuple3<pbrt::Point3,_float>.z,
           (double)((local_d0.o.super_Tuple3<pbrt::Point3,_float>.z +
                    (float)local_a8._0_4_ * local_d0.d.super_Tuple3<pbrt::Vector3,_float>.z) * 1.05)
          );
  }
LAB_00393196:
  putchar(0x7d);
  return;
}

Assistant:

void RealisticCamera::DrawRayPathFromFilm(const Ray &r, bool arrow,
                                          bool toOpticalIntercept) const {
    Float elementZ = 0;
    // Transform _ray_ from camera to lens system space
    static const Transform LensFromCamera = Scale(1, 1, -1);
    Ray ray = LensFromCamera(r);
    printf("{ ");
    if (TraceLensesFromFilm(r, nullptr) == 0) {
        printf("Dashed, RGBColor[.8, .5, .5]");
    } else
        printf("RGBColor[.5, .5, .8]");

    for (int i = elementInterfaces.size() - 1; i >= 0; --i) {
        const LensElementInterface &element = elementInterfaces[i];
        elementZ -= element.thickness;
        bool isStop = (element.curvatureRadius == 0);
        // Compute intersection of ray with lens element
        Float t;
        Normal3f n;
        if (isStop)
            t = -(ray.o.z - elementZ) / ray.d.z;
        else {
            Float radius = element.curvatureRadius;
            Float zCenter = elementZ + element.curvatureRadius;
            if (!IntersectSphericalElement(radius, zCenter, ray, &t, &n))
                goto done;
        }
        CHECK_GE(t, 0);

        printf(", Line[{{%f, %f}, {%f, %f}}]", ray.o.z, ray.o.x, ray(t).z, ray(t).x);

        // Test intersection point against element aperture
        Point3f pHit = ray(t);
        Float r2 = pHit.x * pHit.x + pHit.y * pHit.y;
        Float apertureRadius2 = element.apertureRadius * element.apertureRadius;
        if (r2 > apertureRadius2)
            goto done;
        ray.o = pHit;

        // Update ray path for element interface interaction
        if (!isStop) {
            Vector3f wt;
            Float eta_i = element.eta;
            Float eta_t = (i > 0 && elementInterfaces[i - 1].eta != 0)
                              ? elementInterfaces[i - 1].eta
                              : 1;
            if (!Refract(Normalize(-ray.d), n, eta_t / eta_i, &wt))
                goto done;
            ray.d = wt;
        }
    }

    ray.d = Normalize(ray.d);
    {
        Float ta = std::abs(elementZ / 4);
        if (toOpticalIntercept) {
            ta = -ray.o.x / ray.d.x;
            printf(", Point[{%f, %f}]", ray(ta).z, ray(ta).x);
        }
        printf(", %s[{{%f, %f}, {%f, %f}}]", arrow ? "Arrow" : "Line", ray.o.z, ray.o.x,
               ray(ta).z, ray(ta).x);

        // overdraw the optical axis if needed...
        if (toOpticalIntercept)
            printf(", Line[{{%f, 0}, {%f, 0}}]", ray.o.z, ray(ta).z * 1.05f);
    }

done:
    printf("}");
}